

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

void __thiscall
pbrt::PortalImageInfiniteLight::PDF_Le
          (PortalImageInfiniteLight *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  float fVar1;
  ulong uVar2;
  Float FVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  undefined1 auVar8 [16];
  Vector3f wRender;
  Float duv_dw;
  optional<pbrt::Point2<float>_> uv;
  Bounds2f b;
  float local_40;
  char local_34;
  Bounds2f local_30;
  
  uVar2._0_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
  uVar2._4_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar1 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar8._0_4_ = (float)(undefined4)uVar2 * (float)(undefined4)uVar2;
  auVar8._4_4_ = (float)uVar2._4_4_ * (float)uVar2._4_4_;
  auVar8._8_8_ = 0;
  auVar4 = vhaddps_avx(auVar8,auVar8);
  auVar4 = ZEXT416((uint)(auVar4._0_4_ + fVar1 * fVar1));
  auVar4 = vsqrtss_avx(auVar4,auVar4);
  auVar5._0_8_ = uVar2 ^ 0x8000000080000000;
  auVar5._8_4_ = 0x80000000;
  auVar5._12_4_ = 0x80000000;
  fVar7 = auVar4._0_4_;
  auVar4._4_4_ = fVar7;
  auVar4._0_4_ = fVar7;
  auVar4._8_4_ = fVar7;
  auVar4._12_4_ = fVar7;
  wRender.super_Tuple3<pbrt::Vector3,_float>.z = -fVar1 / fVar7;
  auVar4 = vdivps_avx(auVar5,auVar4);
  wRender.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar4._0_8_;
  ImageFromRender((PortalImageInfiniteLight *)&stack0xffffffffffffffc4,wRender,(Float *)this);
  if ((local_34 == '\x01') && ((local_40 != 0.0 || (NAN(local_40))))) {
    auVar6._8_4_ = 0x3f800000;
    auVar6._0_8_ = 0x3f8000003f800000;
    auVar6._12_4_ = 0x3f800000;
    local_30 = (Bounds2f)vmovlhps_avx(ZEXT416(0) << 0x40,auVar6);
    FVar3 = WindowedPiecewiseConstant2D::PDF
                      (&this->distribution,(Point2f *)&stack0xffffffffffffffc4,
                       &stack0xffffffffffffffd0);
    *pdfPos = 1.0 / (this->sceneRadius * this->sceneRadius * 3.1415927);
    *pdfDir = FVar3 / local_40;
    return;
  }
  *pdfDir = 0.0;
  *pdfPos = 0.0;
  return;
}

Assistant:

void PortalImageInfiniteLight::PDF_Le(const Ray &ray, Float *pdfPos,
                                      Float *pdfDir) const {
    // TODO: negate here or???
    Vector3f w = -Normalize(ray.d);
    Float duv_dw;
    pstd::optional<Point2f> uv = ImageFromRender(w, &duv_dw);

    if (!uv || duv_dw == 0) {
        *pdfPos = *pdfDir = 0;
        return;
    }

    Bounds2f b(Point2f(0, 0), Point2f(1, 1));
    Float pdf = distribution.PDF(*uv, b);

#if 0
    Normal3f n = Normal3f(portalFrame.z);
    *pdfPos = 1 / (Area() * AbsDot(n, w));
#else
    *pdfPos = 1 / (Pi * Sqr(sceneRadius));
#endif

    *pdfDir = pdf / duv_dw;
}